

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

expected<const_Command::Arg_*,_Commands::MatchFailure> *
make_expected_error(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
                   shared_ptr<const_SyntaxTree> *hint,Arg *arginfo)

{
  unreachable_exception *this;
  MatchFailure MStack_48;
  MatchFailure local_30;
  
  switch(arginfo->type) {
  case Param:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = BadArgument;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case Label:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = NoSuchLabel;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case Integer:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = ExpectedInt;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case Float:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = ExpectedFloat;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case TextLabel:
  case TextLabel16:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = ExpectedTextLabel;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case TextLabel32:
  case String:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = ExpectedStringLiteral;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  case Constant:
    std::__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)&MStack_48,
               &hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>);
    MStack_48.reason = NoSuchConstant;
    Commands::MatchFailure::MatchFailure(&local_30,&MStack_48);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,(unexpected_type<Commands::MatchFailure> *)&local_30);
    break;
  default:
    this = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(239)."
              );
    __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&MStack_48.context.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static auto make_expected_error(const shared_ptr<const SyntaxTree>& hint, 
                                const Command::Arg& arginfo) -> expected<const Command::Arg*, MatchFailure>
{
    switch(arginfo.type)
    {
        case ArgType::Param:
            return make_unexpected(MatchFailure{ hint, MatchFailure::BadArgument });
        case ArgType::Integer:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedInt });
        case ArgType::Float:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedFloat });
        case ArgType::Label:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchLabel });
        case ArgType::Constant:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchConstant });
        case ArgType::TextLabel:
        case ArgType::TextLabel16:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedTextLabel });
        case ArgType::TextLabel32:
        case ArgType::String:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedStringLiteral });
        default:
            Unreachable();
    }
}